

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecPat.c
# Opt level: O0

void Cec_ManPatSavePattern(Cec_ManPat_t *pMan,Cec_ManSat_t *p,Gia_Obj_t *pObj)

{
  Gia_Man_t *pGVar1;
  undefined8 uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  abctime aVar6;
  Gia_Obj_t *pGVar7;
  abctime aVar8;
  Vec_Int_t *local_70;
  abctime clkTotal;
  int nPatLits;
  Vec_Int_t *vPat;
  Gia_Obj_t *pObj_local;
  Cec_ManSat_t *p_local;
  Cec_ManPat_t *pMan_local;
  
  aVar6 = Abc_Clock();
  iVar3 = Gia_ObjIsCo(pObj);
  if (iVar3 == 0) {
    __assert_fail("Gia_ObjIsCo(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecPat.c"
                  ,0x16d,"void Cec_ManPatSavePattern(Cec_ManPat_t *, Cec_ManSat_t *, Gia_Obj_t *)");
  }
  pMan->nPats = pMan->nPats + 1;
  pMan->nPatsAll = pMan->nPatsAll + 1;
  Gia_ManIncrementTravId(p->pAig);
  pGVar1 = p->pAig;
  pGVar7 = Gia_ObjFanin0(pObj);
  iVar3 = Cec_ManPatComputePattern_rec(p,pGVar1,pGVar7);
  pGVar7 = Gia_ObjFanin0(pObj);
  uVar2 = *(undefined8 *)pGVar7;
  uVar4 = Gia_ObjFaninC0(pObj);
  if (((uint)((ulong)uVar2 >> 0x3e) & 1 ^ uVar4) == 1) {
    pMan->nPatLits = iVar3 + pMan->nPatLits;
    pMan->nPatLitsAll = iVar3 + pMan->nPatLitsAll;
    Vec_IntClear(pMan->vPattern1);
    Gia_ManIncrementTravId(p->pAig);
    pGVar1 = p->pAig;
    pGVar7 = Gia_ObjFanin0(pObj);
    Cec_ManPatComputePattern1_rec(pGVar1,pGVar7,pMan->vPattern1);
    Vec_IntClear(pMan->vPattern2);
    Gia_ManIncrementTravId(p->pAig);
    pGVar1 = p->pAig;
    pGVar7 = Gia_ObjFanin0(pObj);
    Cec_ManPatComputePattern2_rec(pGVar1,pGVar7,pMan->vPattern2);
    iVar3 = Vec_IntSize(pMan->vPattern1);
    iVar5 = Vec_IntSize(pMan->vPattern2);
    if (iVar3 < iVar5) {
      local_70 = pMan->vPattern1;
    }
    else {
      local_70 = pMan->vPattern2;
    }
    iVar3 = Vec_IntSize(local_70);
    pMan->nPatLitsMin = iVar3 + pMan->nPatLitsMin;
    iVar3 = Vec_IntSize(local_70);
    pMan->nPatLitsMinAll = iVar3 + pMan->nPatLitsMinAll;
    Vec_IntSort(local_70,0);
    Cec_ManPatStore(pMan,local_70);
    aVar8 = Abc_Clock();
    pMan->timeTotal = (aVar8 - aVar6) + pMan->timeTotal;
    return;
  }
  __assert_fail("(Gia_ObjFanin0(pObj)->fMark1 ^ Gia_ObjFaninC0(pObj)) == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecPat.c"
                ,0x174,"void Cec_ManPatSavePattern(Cec_ManPat_t *, Cec_ManSat_t *, Gia_Obj_t *)");
}

Assistant:

void Cec_ManPatSavePattern( Cec_ManPat_t * pMan, Cec_ManSat_t *  p, Gia_Obj_t * pObj )
{
    Vec_Int_t * vPat;
    int nPatLits;
    abctime clkTotal = Abc_Clock();
//    abctime clk;
    assert( Gia_ObjIsCo(pObj) );
    pMan->nPats++;
    pMan->nPatsAll++;
    // compute values in the cone of influence
//clk = Abc_Clock();
    Gia_ManIncrementTravId( p->pAig );
    nPatLits = Cec_ManPatComputePattern_rec( p, p->pAig, Gia_ObjFanin0(pObj) );
    assert( (Gia_ObjFanin0(pObj)->fMark1 ^ Gia_ObjFaninC0(pObj)) == 1 );
    pMan->nPatLits += nPatLits;
    pMan->nPatLitsAll += nPatLits;
//pMan->timeFind += Abc_Clock() - clk;
    // compute sensitizing path
//clk = Abc_Clock();
    Vec_IntClear( pMan->vPattern1 );
    Gia_ManIncrementTravId( p->pAig );
    Cec_ManPatComputePattern1_rec( p->pAig, Gia_ObjFanin0(pObj), pMan->vPattern1 );
    // compute sensitizing path
    Vec_IntClear( pMan->vPattern2 );
    Gia_ManIncrementTravId( p->pAig );
    Cec_ManPatComputePattern2_rec( p->pAig, Gia_ObjFanin0(pObj), pMan->vPattern2 );
    // compare patterns
    vPat = Vec_IntSize(pMan->vPattern1) < Vec_IntSize(pMan->vPattern2) ? pMan->vPattern1 : pMan->vPattern2;
    pMan->nPatLitsMin += Vec_IntSize(vPat);
    pMan->nPatLitsMinAll += Vec_IntSize(vPat);
//pMan->timeShrink += Abc_Clock() - clk;
    // verify pattern using ternary simulation
//clk = Abc_Clock();
//    Cec_ManPatVerifyPattern( p->pAig, pObj, vPat );
//pMan->timeVerify += Abc_Clock() - clk;
    // sort pattern
//clk = Abc_Clock();
    Vec_IntSort( vPat, 0 );
//pMan->timeSort += Abc_Clock() - clk;
    // save pattern
    Cec_ManPatStore( pMan, vPat );
    pMan->timeTotal += Abc_Clock() - clkTotal;
}